

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlParseExtParsedEnt(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_48;
  undefined *local_40;
  PyObject *pyobj_ctxt;
  xmlParserCtxtPtr ctxt;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlParseExtParsedEnt",&local_40);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (local_40 == &_Py_NoneStruct) {
      local_48 = (PyObject *)0x0;
    }
    else {
      local_48 = *(PyObject **)(local_40 + 0x10);
    }
    pyobj_ctxt = local_48;
    ctxt._4_4_ = xmlParseExtParsedEnt(local_48);
    self_local = libxml_intWrap(ctxt._4_4_);
  }
  return self_local;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlParseExtParsedEnt(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlParseExtParsedEnt", &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    c_retval = xmlParseExtParsedEnt(ctxt);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}